

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator local_1a1;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  if ((this->TargetTypeValue != INTERFACE_LIBRARY) ||
     (bVar3 = whiteListedInterfaceProperty(prop), bVar3)) {
    iVar4 = std::__cxx11::string::compare((char *)prop);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)prop);
      if (iVar4 == 0) {
        if (value == (char *)0x0) {
          return;
        }
        if (*value == '\0') {
          return;
        }
        pcVar2 = (this->Internal).Pointer;
        local_1a0._0_8_ = local_1a0 + 0x10;
        sVar6 = strlen(value);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,value,value + sVar6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
        if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
          operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
        }
        cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a0,this->Makefile);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                  (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,
                   (cmListFileBacktrace *)local_1a0);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)prop);
        if (iVar4 == 0) {
          if (value == (char *)0x0) {
            return;
          }
          if (*value == '\0') {
            return;
          }
          pcVar2 = (this->Internal).Pointer;
          local_1a0._0_8_ = local_1a0 + 0x10;
          sVar6 = strlen(value);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,value,value + sVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pcVar2->CompileOptionsEntries,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0)
          ;
          if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
            operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
          }
          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a0,this->Makefile);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                    (&((this->Internal).Pointer)->CompileOptionsBacktraces,
                     (cmListFileBacktrace *)local_1a0);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)prop);
          if (iVar4 == 0) {
            if (value == (char *)0x0) {
              return;
            }
            if (*value == '\0') {
              return;
            }
            pcVar2 = (this->Internal).Pointer;
            local_1a0._0_8_ = local_1a0 + 0x10;
            sVar6 = strlen(value);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,value,value + sVar6)
            ;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pcVar2->CompileFeaturesEntries,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a0);
            if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
              operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
            }
            cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a0,this->Makefile);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&((this->Internal).Pointer)->CompileFeaturesBacktraces,
                       (cmListFileBacktrace *)local_1a0);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)prop);
            if (iVar4 == 0) {
              if (value == (char *)0x0) {
                return;
              }
              if (*value == '\0') {
                return;
              }
              pcVar2 = (this->Internal).Pointer;
              local_1a0._0_8_ = local_1a0 + 0x10;
              sVar6 = strlen(value);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a0,value,value + sVar6);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &pcVar2->CompileDefinitionsEntries,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0);
              if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
                operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
              }
              cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a0,this->Makefile);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                         (cmListFileBacktrace *)local_1a0);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)prop);
              if ((iVar4 == 0) && (this->IsImportedTarget == true)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,
                           "EXPORT_NAME property can\'t be set on imported targets (\"",0x38);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a0,(this->Name)._M_dataplus._M_p,
                                    (this->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
                pcVar1 = this->Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8,false);
                goto LAB_0031149b;
              }
              iVar4 = std::__cxx11::string::compare((char *)prop);
              if (iVar4 == 0) {
                if (value == (char *)0x0) {
                  return;
                }
                if (*value == '\0') {
                  return;
                }
                cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a0,this->Makefile);
                pcVar2 = (this->Internal).Pointer;
                local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                sVar6 = strlen(value);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1c8,value,value + sVar6);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar2->LinkImplementationPropertyEntries,&local_1c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                           (value_type *)local_1a0);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)prop);
                if (iVar4 != 0) {
                  cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
                  return;
                }
                if (this->IsImportedTarget == true) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,
                             "SOURCES property can\'t be set on imported targets (\"",0x34);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a0,(this->Name)._M_dataplus._M_p,
                                      (this->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
                  pcVar1 = this->Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8,false);
                  goto LAB_0031149b;
                }
                cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a0,this->Makefile);
                pcVar2 = (this->Internal).Pointer;
                std::__cxx11::string::string((string *)&local_1c8,value,&local_1a1);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar2->SourceEntries,&local_1c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->SourceBacktraces,(value_type *)local_1a0);
              }
            }
          }
        }
      }
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a0);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"NAME property is read-only\n",0x1b);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \"",
               0x4f);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(prop->_M_dataplus)._M_p,prop->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" is not allowed.",0x11);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8,false);
  }
LAB_0031149b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    if (value && *value)
      {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    if (value && *value)
      {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_FEATURES")
    {
    if (value && *value)
      {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    if (value && *value)
      {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    if (value && *value)
      {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
      }
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
    }
  else
    {
    this->Properties.AppendProperty(prop, value, asString);
    }
}